

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O1

void __thiscall Imf_2_5::anon_unknown_17::LineCompositeTask::execute(LineCompositeTask *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  Data *pDVar6;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar7;
  pointer ppcVar8;
  bool bVar9;
  short sVar10;
  long lVar11;
  iterator iVar12;
  Iterator IVar13;
  ulong uVar14;
  long lVar15;
  Iterator tmp;
  vector<const_float_*,_std::allocator<const_float_*>_> inputs;
  vector<float,_std::allocator<float>_> output_pixel;
  long local_98;
  DeepCompositing local_88;
  vector<const_float_*,_std::allocator<const_float_*>_> local_80;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  *local_68;
  vector<float,_std::allocator<float>_> local_60;
  DeepCompositing *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  iVar1 = this->_y;
  iVar2 = this->_start;
  pDVar6 = this->_Data;
  pvVar7 = this->_names;
  local_68 = this->_pointers;
  local_38 = this->_total_sizes;
  local_40 = this->_num_sources;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_60,
             (long)(pvVar7->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(pvVar7->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_80);
  std::vector<const_float_*,_std::allocator<const_float_*>_>::vector
            (&local_80,
             (long)(pvVar7->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(pvVar7->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_88);
  DeepCompositing::DeepCompositing(&local_88);
  local_48 = &local_88;
  if (pDVar6->_comp != (DeepCompositing *)0x0) {
    local_48 = pDVar6->_comp;
  }
  iVar3 = (pDVar6->_dataWindow).min.x;
  iVar4 = (pDVar6->_dataWindow).max.x;
  if (iVar3 <= iVar4) {
    lVar15 = (long)((iVar1 - iVar2) * ((iVar4 - iVar3) + 1));
    local_98 = (long)iVar3;
    do {
      if (pDVar6->_zback == true) {
        if ((pvVar7->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish !=
            (pvVar7->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start) {
          lVar11 = 0;
          uVar14 = 0;
          do {
            local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14] =
                 *(float **)
                  (*(long *)(*(long *)&(((local_68->
                                         super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                       )._M_impl.super__Vector_impl_data + lVar11) + lVar15 * 8);
            uVar14 = uVar14 + 1;
            lVar11 = lVar11 + 0x18;
          } while (uVar14 < (ulong)((long)(pvVar7->
                                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pvVar7->
                                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 3));
        }
      }
      else {
        *local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
         super__Vector_impl_data._M_start =
             *(float **)
              (**(long **)&(((local_68->
                             super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                           )._M_impl.super__Vector_impl_data + lVar15 * 8);
        local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
        super__Vector_impl_data._M_start[1] =
             *(float **)
              (**(long **)&(((local_68->
                             super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                           )._M_impl.super__Vector_impl_data + lVar15 * 8);
        if (0x10 < (ulong)((long)(pvVar7->
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar7->
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                _M_impl.super__Vector_impl_data._M_start)) {
          uVar14 = 2;
          lVar11 = 6;
          do {
            local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14] =
                 *(float **)
                  (*(long *)(*(long *)&(((local_68->
                                         super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                       )._M_impl.super__Vector_impl_data + lVar11 * 8) + lVar15 * 8)
            ;
            uVar14 = uVar14 + 1;
            lVar11 = lVar11 + 3;
          } while (uVar14 < (ulong)((long)(pvVar7->
                                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pvVar7->
                                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 3));
        }
      }
      ppcVar8 = (pvVar7->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      (*local_48->_vptr_DeepCompositing[2])
                (local_48,local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                 local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                 super__Vector_impl_data._M_start,ppcVar8,
                 (ulong)((long)(pvVar7->
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar8) >> 3,
                 (ulong)(local_38->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[lVar15],
                 (local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start[lVar15]);
      iVar12._M_node = (_Base_ptr)FrameBuffer::begin(&pDVar6->_outputFrameBuffer);
      lVar11 = 0;
      while (IVar13 = FrameBuffer::end(&pDVar6->_outputFrameBuffer),
            (iterator)iVar12._M_node != IVar13._i._M_node) {
        fVar5 = local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start
                [*(int *)((long)(pDVar6->_bufferMap).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar11)];
        if (iVar12._M_node[9]._M_color == _S_black) {
          if ((fVar5 != 0.0) || (NAN(fVar5))) {
            sVar10 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar5 >> 0x17) * 2);
            if (sVar10 == 0) {
              sVar10 = half::convert((int)fVar5);
            }
            else {
              sVar10 = sVar10 + (short)(((uint)fVar5 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar5 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            sVar10 = (short)((uint)fVar5 >> 0x10);
          }
          *(short *)((long)&(iVar12._M_node[9]._M_parent)->_M_color +
                    (long)iVar12._M_node[9]._M_left * local_98 +
                    (long)iVar12._M_node[9]._M_right * (long)iVar1) = sVar10;
        }
        else if (iVar12._M_node[9]._M_color == 2) {
          *(float *)((long)&(iVar12._M_node[9]._M_parent)->_M_color +
                    (long)iVar12._M_node[9]._M_left * local_98 +
                    (long)iVar12._M_node[9]._M_right * (long)iVar1) = fVar5;
        }
        iVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar12._M_node);
        lVar11 = lVar11 + 4;
      }
      lVar15 = lVar15 + 1;
      bVar9 = local_98 < (pDVar6->_dataWindow).max.x;
      local_98 = local_98 + 1;
    } while (bVar9);
  }
  DeepCompositing::~DeepCompositing(&local_88);
  if (local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LineCompositeTask::execute()
{
  composite_line(_y,_start,_Data,*_names,*_pointers,*_total_sizes,*_num_sources);
}